

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<float>::DeterminantInverse
          (TPZFMatrix<float> *this,float *determinant,TPZFMatrix<float> *inverse)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZFMatrix<float> *this_00;
  float *pfVar3;
  long *in_RDX;
  float *in_RSI;
  TPZFNMatrix<100,_float> *in_RDI;
  int64_t r;
  TPZFNMatrix<100,_float> copy;
  TPZFMatrix<float> *in_stack_fffffffffffffd68;
  TPZMatrix<float> *in_stack_fffffffffffffd70;
  long row;
  TPZFMatrix<float> *in_stack_fffffffffffffd88;
  long local_258;
  
  TPZFNMatrix<100,_float>::TPZFNMatrix(in_RDI,in_stack_fffffffffffffd88);
  iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  (**(code **)(*in_RDX + 0x70))(in_RDX,iVar1,iVar2);
  local_258 = 0;
  while( true ) {
    row = local_258;
    this_00 = (TPZFMatrix<float> *)TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    if ((long)this_00 <= row) break;
    in_stack_fffffffffffffd70 =
         (TPZMatrix<float> *)operator()(this_00,row,(int64_t)in_stack_fffffffffffffd70);
    *(float *)&(in_stack_fffffffffffffd70->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable =
         1.0;
    local_258 = local_258 + 1;
  }
  TPZMatrix<float>::Solve_LU(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  *in_RSI = 1.0;
  local_258 = 0;
  while( true ) {
    iVar1 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    if (iVar1 <= local_258) break;
    pfVar3 = operator()(this_00,row,(int64_t)in_stack_fffffffffffffd70);
    *in_RSI = *pfVar3 * *in_RSI;
    local_258 = local_258 + 1;
  }
  TPZFNMatrix<100,_float>::~TPZFNMatrix((TPZFNMatrix<100,_float> *)0x12188f1);
  return;
}

Assistant:

void TPZFMatrix<TVar>::DeterminantInverse(TVar &determinant, TPZFMatrix<TVar> &inverse)
{
    TPZFNMatrix<100, TVar> copy(*this);
    inverse.Redim(this->Rows(),this->Rows());
    int64_t r;
    for(r=0; r<this->Rows(); r++) inverse(r,r) = 1.;
    copy.Solve_LU(&inverse);
    determinant = 1.;
    for(r=0; r<this->Rows(); r++) determinant *= copy(r,r);
}